

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_benchmark_function.hpp
# Opt level: O3

void __thiscall
Catch::Benchmark::Detail::BenchmarkFunction::
model<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svens[P]xxx/xxx/invoke.bench.cpp:101:2)>
::call(model<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_svens[P]xxx_xxx_invoke_bench_cpp:101:2)>
       *this,Chronometer meter)

{
  ulong uVar1;
  ChronometerConcept *pCVar2;
  
  pCVar2 = meter.impl;
  (**pCVar2->_vptr_ChronometerConcept)(pCVar2);
  if (0 < meter.repeats) {
    uVar1 = 0;
    do {
      uVar1 = uVar1 + 1;
    } while ((uint)meter.repeats != uVar1);
  }
  (*pCVar2->_vptr_ChronometerConcept[1])(pCVar2);
  return;
}

Assistant:

void call(Chronometer meter) const override {
                        call(meter, is_callable<Fun(Chronometer)>());
                    }